

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetWindowFontScale(float scale)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  float fVar2;
  
  pIVar1 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  this->FontWindowScale = scale;
  fVar2 = ImGuiWindow::CalcFontSize(this);
  (pIVar1->DrawListSharedData).FontSize = fVar2;
  pIVar1->FontSize = fVar2;
  fVar2 = fVar2 / pIVar1->Font->FontSize;
  (pIVar1->DrawListSharedData).FontScale = fVar2;
  pIVar1->FontScale = fVar2;
  return;
}

Assistant:

void ImGui::SetWindowFontScale(float scale)
{
    IM_ASSERT(scale > 0.0f);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    window->FontWindowScale = scale;
    g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
    g.FontScale = g.DrawListSharedData.FontScale = g.FontSize / g.Font->FontSize;
}